

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int lax)

{
  xmlRegStatePtr state;
  
  if (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0) {
    to = (xmlAutomataStatePtr)0x0;
  }
  else if (to == (xmlAutomataStatePtr)0x0) {
    state = (xmlRegStatePtr)(*xmlMalloc)(0x38);
    if (state == (xmlRegStatePtr)0x0) {
      xmlRegexpErrMemory(am,"allocating state");
      state = (xmlRegStatePtr)0x0;
    }
    else {
      state->type = 0;
      state->mark = XML_REGEXP_MARK_NORMAL;
      state->markd = XML_REGEXP_MARK_NORMAL;
      state->reached = XML_REGEXP_MARK_NORMAL;
      state->trans = (xmlRegTrans *)0x0;
      state->maxTransTo = 0;
      state->nbTransTo = 0;
      state->no = 0;
      state->maxTrans = 0;
      *(undefined8 *)&state->nbTrans = 0;
      state->transTo = (int *)0x0;
      state->type = XML_REGEXP_TRANS_STATE;
      state->mark = XML_REGEXP_MARK_NORMAL;
    }
    xmlRegStatePush(am,state);
    am->state = state;
    xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,state,-1,0x123457 - (uint)(lax == 0));
    to = am->state;
  }
  else {
    xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,to,-1,0x123457 - (uint)(lax == 0));
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		       xmlAutomataStatePtr to, int lax) {
    if ((am == NULL) || (from == NULL))
	return(NULL);
    xmlFAGenerateAllTransition(am, from, to, lax);
    if (to == NULL)
	return(am->state);
    return(to);
}